

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

void __thiscall glcts::anon_unknown_0::DILogger::DILogger(DILogger *this,DILogger *rhs)

{
  string local_38 [32];
  DILogger *local_18;
  DILogger *rhs_local;
  DILogger *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->str_);
  this->null_log_ = (bool)(local_18->null_log_ & 1);
  if ((this->null_log_ & 1U) == 0) {
    std::__cxx11::ostringstream::str();
    std::operator<<(&(this->str_).super_basic_ostream<char,_std::char_traits<char>_>,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

DILogger(const DILogger& rhs)
	{
		null_log_ = rhs.null_log_;
		if (!null_log_)
		{
			str_ << rhs.str_.str();
		}
	}